

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O3

void __thiscall
TCV::checkIfArrayCalledWithRightDimensions
          (TCV *this,Variable *variable,string *nodeName,ASTNode *node)

{
  uint uVar1;
  _Map_pointer pppAVar2;
  _Elt_pointer ppAVar3;
  _Elt_pointer ppAVar4;
  uint __val;
  uint uVar5;
  int iVar6;
  ASTNode *pAVar7;
  uint *puVar8;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *pdVar9;
  int *piVar10;
  long *plVar11;
  uint uVar12;
  long *plVar13;
  size_type *psVar14;
  ulong uVar15;
  _Map_pointer pppAVar16;
  _Elt_pointer ppAVar17;
  uint __len;
  _Elt_pointer ppAVar18;
  string errorString;
  string lineNumber;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  Variable *local_88;
  ASTNode *local_80;
  string *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_80 = node;
  local_78 = nodeName;
  pAVar7 = AST::ASTNode::getChild(node,0);
  puVar8 = (uint *)AST::ASTNode::getLineNumber(pAVar7);
  uVar1 = *puVar8;
  __val = -uVar1;
  if (0 < (int)uVar1) {
    __val = uVar1;
  }
  __len = 1;
  if (9 < __val) {
    uVar15 = (ulong)__val;
    uVar5 = 4;
    do {
      __len = uVar5;
      uVar12 = (uint)uVar15;
      if (uVar12 < 100) {
        __len = __len - 2;
        goto LAB_0012f3bf;
      }
      if (uVar12 < 1000) {
        __len = __len - 1;
        goto LAB_0012f3bf;
      }
      if (uVar12 < 10000) goto LAB_0012f3bf;
      uVar15 = uVar15 / 10000;
      uVar5 = __len + 4;
    } while (99999 < uVar12);
    __len = __len + 1;
  }
LAB_0012f3bf:
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_a8,(char)__len - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_a8._M_dataplus._M_p + (uVar1 >> 0x1f),__len,__val);
  if (variable->dimensions != 0) {
    local_88 = variable;
    pAVar7 = AST::ASTNode::getChild(local_80,1);
    pdVar9 = AST::ASTNode::getChildren(pAVar7);
    pppAVar16 = (pdVar9->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl
                .super__Deque_impl_data._M_finish._M_node;
    pppAVar2 = (pdVar9->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
               super__Deque_impl_data._M_start._M_node;
    ppAVar17 = (pdVar9->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
    ppAVar3 = (pdVar9->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
              super__Deque_impl_data._M_finish._M_first;
    ppAVar18 = (pdVar9->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
               super__Deque_impl_data._M_start._M_cur;
    ppAVar4 = (pdVar9->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
              super__Deque_impl_data._M_start._M_last;
    piVar10 = Variable::getDimensions(local_88);
    if (*piVar10 ==
        (int)((ulong)((long)ppAVar4 - (long)ppAVar18) >> 3) +
        (int)((ulong)((long)ppAVar17 - (long)ppAVar3) >> 3) +
        ((((uint)((int)pppAVar16 - (int)pppAVar2) >> 3) - 1) +
        (uint)(pppAVar16 == (_Map_pointer)0x0)) * 0x40) {
      pAVar7 = AST::ASTNode::getChild(local_80,1);
      pdVar9 = AST::ASTNode::getChildren(pAVar7);
      ppAVar17 = (pdVar9->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_cur;
      ppAVar3 = (pdVar9->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl
                .super__Deque_impl_data._M_finish._M_cur;
      if (ppAVar17 != ppAVar3) {
        ppAVar18 = (pdVar9->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>).
                   _M_impl.super__Deque_impl_data._M_start._M_last;
        pppAVar16 = (pdVar9->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>).
                    _M_impl.super__Deque_impl_data._M_start._M_node;
        do {
          (**(*ppAVar17)->_vptr_ASTNode)(*ppAVar17,this);
          iVar6 = std::__cxx11::string::compare((char *)&this->returnType);
          if ((iVar6 != 0) &&
             (iVar6 = std::__cxx11::string::compare((char *)&this->returnType), iVar6 != 0)) {
            std::operator+(&local_c8,"Array dimensions should be of type integer at line ",&local_a8
                          );
            Semantic::Detector::addError(this->detector,&local_c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p == &local_c8.field_2) goto LAB_0012f66d;
            goto LAB_0012f660;
          }
          ppAVar17 = ppAVar17 + 1;
          if (ppAVar17 == ppAVar18) {
            ppAVar17 = pppAVar16[1];
            pppAVar16 = pppAVar16 + 1;
            ppAVar18 = ppAVar17 + 0x40;
          }
        } while (ppAVar17 != ppAVar3);
      }
      Variable::getRawType_abi_cxx11_(&local_c8,local_88);
      std::__cxx11::string::operator=((string *)&this->returnType,(string *)&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p == &local_c8.field_2) goto LAB_0012f66d;
    }
    else {
      std::operator+(&local_50,"missing dimensions for variable ",local_78);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar13 = plVar11 + 2;
      if ((long *)*plVar11 == plVar13) {
        local_60 = *plVar13;
        lStack_58 = plVar11[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar13;
        local_70 = (long *)*plVar11;
      }
      local_68 = plVar11[1];
      *plVar11 = (long)plVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_70,(ulong)local_a8._M_dataplus._M_p);
      psVar14 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_c8.field_2._M_allocated_capacity = *psVar14;
        local_c8.field_2._8_8_ = plVar11[3];
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      }
      else {
        local_c8.field_2._M_allocated_capacity = *psVar14;
        local_c8._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_c8._M_string_length = plVar11[1];
      *plVar11 = (long)psVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      Semantic::Detector::addError(this->detector,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p == &local_c8.field_2) goto LAB_0012f66d;
    }
LAB_0012f660:
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
LAB_0012f66d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TCV::checkIfArrayCalledWithRightDimensions(const Variable *variable, std::string &nodeName, AST::ASTNode *node) {
    std::string lineNumber = std::to_string(node->getChild(0)->getLineNumber());
    if (variable->isArray()) {
        int indices = node->getChild(1)->getChildren().size();
        if (variable->getDimensions() != indices) {
            std::string errorString = "missing dimensions for variable " + nodeName + " at line " + lineNumber;
            detector->addError(errorString);
        } else {
            for (const auto &index : node->getChild(1)->getChildren()) {
                index->accept(*this);
                if (returnType != "intnum" && returnType != "integer") {
                    std::string errorString = "Array dimensions should be of type integer at line " + lineNumber;
                    detector->addError(errorString);
                    return;
                }
            }
            returnType = variable->getRawType();
        }
    }
}